

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::buffer_get_hlsl_counter_buffer
          (Compiler *this,VariableID id,uint32_t *counter_id)

{
  bool bVar1;
  Meta *pMVar2;
  
  pMVar2 = ParsedIR::find_meta(&this->ir,(ID)id.id);
  if ((pMVar2 == (Meta *)0x0) || (pMVar2->hlsl_magic_counter_buffer == 0)) {
    bVar1 = false;
  }
  else {
    *counter_id = pMVar2->hlsl_magic_counter_buffer;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Compiler::buffer_get_hlsl_counter_buffer(VariableID id, uint32_t &counter_id) const
{
	auto *m = ir.find_meta(id);

	// First, check for the proper decoration.
	if (m && m->hlsl_magic_counter_buffer != 0)
	{
		counter_id = m->hlsl_magic_counter_buffer;
		return true;
	}
	else
		return false;
}